

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,Registrar *aValue,RegistrarId *aRetId)

{
  Status SVar1;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,JSON_RGR_SEQ_abi_cxx11_,DAT_002e2828 + JSON_RGR_SEQ_abi_cxx11_);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,JSON_RGR_abi_cxx11_,DAT_002e2808 + JSON_RGR_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>
                    (this,aValue,aRetId,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(Registrar const &aValue, RegistrarId &aRetId)
{
    return AddOne<Registrar, RegistrarId>(aValue, aRetId, JSON_RGR_SEQ, JSON_RGR);
}